

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O2

void __thiscall
Kumu::XMLElement::RenderElement(XMLElement *this,string *outbuf,ui32_t *depth,bool *pretty)

{
  ElementList *pEVar1;
  bool *pretty_00;
  ui32_t *puVar2;
  _List_node_base *p_Var3;
  XMLElement *pXVar4;
  ui32_t local_4c;
  bool *local_48;
  ui32_t *local_40;
  string *local_38;
  
  local_48 = pretty;
  if (*pretty == true) {
    add_spacer(outbuf,*depth);
  }
  local_40 = depth;
  std::__cxx11::string::append((char *)outbuf);
  local_38 = &this->m_Name;
  std::__cxx11::string::append((string *)outbuf);
  pXVar4 = this;
  while (pXVar4 = (XMLElement *)
                  (pXVar4->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>
                  ._M_impl._M_node.super__List_node_base._M_next, pXVar4 != this) {
    std::__cxx11::string::append((char *)outbuf);
    std::__cxx11::string::append((string *)outbuf);
    std::__cxx11::string::append((char *)outbuf);
    std::__cxx11::string::append((string *)outbuf);
    std::__cxx11::string::append((char *)outbuf);
  }
  std::__cxx11::string::append((char *)outbuf);
  pEVar1 = &this->m_ChildList;
  if ((this->m_ChildList).super__List_base<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)pEVar1) {
    if ((this->m_Body)._M_string_length != 0) {
      std::__cxx11::string::append((string *)outbuf);
    }
  }
  else {
    std::__cxx11::string::append((char *)outbuf);
    if ((this->m_Body)._M_string_length != 0) {
      std::__cxx11::string::append((string *)outbuf);
    }
    puVar2 = local_40;
    pretty_00 = local_48;
    p_Var3 = (_List_node_base *)pEVar1;
    while (p_Var3 = (((_List_base<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_> *)
                     &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)pEVar1) {
      local_4c = *puVar2 + 1;
      RenderElement((XMLElement *)p_Var3[1]._M_next,outbuf,&local_4c,pretty_00);
    }
    if (*pretty_00 != false) {
      add_spacer(outbuf,*puVar2);
    }
  }
  std::__cxx11::string::append((char *)outbuf);
  std::__cxx11::string::append((string *)outbuf);
  std::__cxx11::string::append((char *)outbuf);
  return;
}

Assistant:

void
Kumu::XMLElement::RenderElement(std::string& outbuf, const ui32_t& depth, const bool& pretty) const
{
  if ( pretty )
    {
      add_spacer(outbuf, depth);
    }

  outbuf += "<";
  outbuf += m_Name;

  // render attributes
  for ( Attr_i i = m_AttrList.begin(); i != m_AttrList.end(); ++i )
    {
      outbuf += " ";
      outbuf += (*i).name;
      outbuf += "=\"";
      outbuf += (*i).value;
      outbuf += "\"";
    }

  outbuf += ">";

  // body contents and children
  if ( ! m_ChildList.empty() )
    {
      outbuf += "\n";

      // render body
      if ( m_Body.length() > 0 )
	{
	  outbuf += m_Body;
	}

      for ( Elem_i i = m_ChildList.begin(); i != m_ChildList.end(); ++i )
	{
	  (*i)->RenderElement(outbuf, depth + 1, pretty);
	}

      if ( pretty )
	{
	  add_spacer(outbuf, depth);
	}
    }
  else if ( m_Body.length() > 0 )
    {
      outbuf += m_Body;
    }

  outbuf += "</";
  outbuf += m_Name;
  outbuf += ">\n";
}